

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

void __thiscall glTF2::Asset::Asset(Asset *this,IOSystem *io)

{
  IOSystem *io_local;
  Asset *this_local;
  
  this->mIOSystem = io;
  std::__cxx11::string::string((string *)&this->mCurrentAssetDir);
  std::vector<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>::vector(&this->mDicts);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->mUsedIds);
  Ref<glTF2::Buffer>::Ref(&this->mBodyBuffer);
  AssetMetadata::AssetMetadata(&this->asset);
  LazyDict<glTF2::Accessor>::LazyDict(&this->accessors,this,"accessors",(char *)0x0);
  LazyDict<glTF2::Animation>::LazyDict(&this->animations,this,"animations",(char *)0x0);
  LazyDict<glTF2::Buffer>::LazyDict(&this->buffers,this,"buffers",(char *)0x0);
  LazyDict<glTF2::BufferView>::LazyDict(&this->bufferViews,this,"bufferViews",(char *)0x0);
  LazyDict<glTF2::Camera>::LazyDict(&this->cameras,this,"cameras",(char *)0x0);
  LazyDict<glTF2::Light>::LazyDict(&this->lights,this,"lights","KHR_lights_punctual");
  LazyDict<glTF2::Image>::LazyDict(&this->images,this,"images",(char *)0x0);
  LazyDict<glTF2::Material>::LazyDict(&this->materials,this,"materials",(char *)0x0);
  LazyDict<glTF2::Mesh>::LazyDict(&this->meshes,this,"meshes",(char *)0x0);
  LazyDict<glTF2::Node>::LazyDict(&this->nodes,this,"nodes",(char *)0x0);
  LazyDict<glTF2::Sampler>::LazyDict(&this->samplers,this,"samplers",(char *)0x0);
  LazyDict<glTF2::Scene>::LazyDict(&this->scenes,this,"scenes",(char *)0x0);
  LazyDict<glTF2::Skin>::LazyDict(&this->skins,this,"skins",(char *)0x0);
  LazyDict<glTF2::Texture>::LazyDict(&this->textures,this,"textures",(char *)0x0);
  Ref<glTF2::Scene>::Ref(&this->scene);
  memset(&this->extensionsUsed,0,3);
  return;
}

Assistant:

Asset(IOSystem* io = 0)
            : mIOSystem(io)
            , asset()
            , accessors     (*this, "accessors")
            , animations    (*this, "animations")
            , buffers       (*this, "buffers")
            , bufferViews   (*this, "bufferViews")
            , cameras       (*this, "cameras")
            , lights        (*this, "lights", "KHR_lights_punctual")
            , images        (*this, "images")
            , materials     (*this, "materials")
            , meshes        (*this, "meshes")
            , nodes         (*this, "nodes")
            , samplers      (*this, "samplers")
            , scenes        (*this, "scenes")
            , skins         (*this, "skins")
            , textures      (*this, "textures")
        {
            memset(&extensionsUsed, 0, sizeof(extensionsUsed));
        }